

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cFramebufferNoAttachmentsTests.cpp
# Opt level: O0

void glcts::checkErrorEqualsExpected(GLenum err,GLenum expected,char *msg,char *file,int line)

{
  ostream *poVar1;
  OutOfMemoryError *this;
  char *pcVar2;
  Error *this_00;
  Enum<int,_2UL> EVar3;
  Enum<int,_2UL> local_1e0;
  GetNameFunc local_1d0;
  int local_1c8;
  Enum<int,_2UL> local_1c0 [2];
  undefined1 local_1a0 [8];
  ostringstream msgStr;
  int line_local;
  char *file_local;
  char *msg_local;
  GLenum expected_local;
  GLenum err_local;
  
  if (err == expected) {
    return;
  }
  msgStr._372_4_ = line;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,"glGetError() returned ");
  EVar3 = glu::getErrorStr(err);
  local_1d0 = EVar3.m_getName;
  local_1c8 = EVar3.m_value;
  local_1c0[0].m_getName = local_1d0;
  local_1c0[0].m_value = local_1c8;
  poVar1 = tcu::Format::operator<<(poVar1,local_1c0);
  poVar1 = std::operator<<(poVar1,", expected ");
  EVar3 = glu::getErrorStr(expected);
  local_1e0.m_getName = EVar3.m_getName;
  local_1e0.m_value = EVar3.m_value;
  tcu::Format::operator<<(poVar1,&local_1e0);
  if (msg != (char *)0x0) {
    poVar1 = std::operator<<((ostream *)local_1a0," in \'");
    poVar1 = std::operator<<(poVar1,msg);
    std::operator<<(poVar1,"\'");
  }
  if (err == 0x505) {
    this = (OutOfMemoryError *)__cxa_allocate_exception(0x38);
    std::__cxx11::ostringstream::str();
    pcVar2 = (char *)std::__cxx11::string::c_str();
    glu::OutOfMemoryError::OutOfMemoryError(this,pcVar2,"",file,msgStr._372_4_);
    __cxa_throw(this,&glu::OutOfMemoryError::typeinfo,glu::OutOfMemoryError::~OutOfMemoryError);
  }
  this_00 = (Error *)__cxa_allocate_exception(0x38);
  std::__cxx11::ostringstream::str();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  glu::Error::Error(this_00,err,pcVar2,"",file,msgStr._372_4_);
  __cxa_throw(this_00,&glu::Error::typeinfo,glu::Error::~Error);
}

Assistant:

void checkErrorEqualsExpected(GLenum err, GLenum expected, const char* msg, const char* file, int line)
{
	if (err != expected)
	{
		std::ostringstream msgStr;
		msgStr << "glGetError() returned " << glu::getErrorStr(err) << ", expected " << glu::getErrorStr(expected);

		if (msg)
			msgStr << " in '" << msg << "'";

		if (err == GL_OUT_OF_MEMORY)
			throw glu::OutOfMemoryError(msgStr.str().c_str(), "", file, line);
		else
			throw glu::Error(err, msgStr.str().c_str(), "", file, line);
	}
}